

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O3

void __thiscall
luna::Exception::
SetWhat<char_const*&,char,int&,char,int&,char,char_const(&)[24],std::__cxx11::string&,char_const(&)[2]>
          (Exception *this,ostringstream *oss,char **arg,char *args,int *args_1,char *args_2,
          int *args_3,char *args_4,char (*args_5) [24],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
          char (*args_7) [2])

{
  char *__s;
  undefined8 in_RAX;
  size_t sVar1;
  undefined8 uStack_38;
  
  __s = *arg;
  uStack_38 = in_RAX;
  if (__s == (char *)0x0) {
    std::ios::clear((int)oss + (int)*(undefined8 *)(*(long *)oss + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,__s,sVar1);
  }
  uStack_38 = CONCAT17(*args,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)oss,(char *)((long)&uStack_38 + 7),1);
  SetWhat<int&,char,int&,char,char_const(&)[24],std::__cxx11::string&,char_const(&)[2]>
            (this,oss,args_1,args_2,args_3,args_4,args_5,args_6,args_7);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }